

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O3

llama_batch *
llama_batch_init(llama_batch *__return_storage_ptr__,int32_t n_tokens_alloc,int32_t embd,
                int32_t n_seq_max)

{
  size_t __size;
  llama_token *plVar1;
  llama_pos *plVar2;
  int32_t *piVar3;
  llama_seq_id **pplVar4;
  llama_seq_id *plVar5;
  int8_t *piVar6;
  ulong uVar7;
  size_t __size_00;
  
  *(undefined8 *)__return_storage_ptr__ = 0;
  __return_storage_ptr__->token = (llama_token *)0x0;
  __return_storage_ptr__->embd = (float *)0x0;
  __size_00 = (size_t)n_tokens_alloc;
  __size = __size_00 * 4;
  plVar1 = (llama_token *)malloc((long)(int)(embd + (uint)(embd == 0)) * __size);
  (&__return_storage_ptr__->token)[embd != 0] = plVar1;
  plVar2 = (llama_pos *)malloc(__size);
  __return_storage_ptr__->pos = plVar2;
  piVar3 = (int32_t *)malloc(__size);
  __return_storage_ptr__->n_seq_id = piVar3;
  pplVar4 = (llama_seq_id **)malloc(__size_00 * 8 + 8);
  __return_storage_ptr__->seq_id = pplVar4;
  if (0 < n_tokens_alloc) {
    uVar7 = 0;
    do {
      plVar5 = (llama_seq_id *)malloc((long)n_seq_max << 2);
      pplVar4[uVar7] = plVar5;
      uVar7 = uVar7 + 1;
    } while ((uint)n_tokens_alloc != uVar7);
  }
  pplVar4[__size_00] = (llama_seq_id *)0x0;
  piVar6 = (int8_t *)malloc(__size_00);
  __return_storage_ptr__->logits = piVar6;
  return __return_storage_ptr__;
}

Assistant:

struct llama_batch llama_batch_init(int32_t n_tokens_alloc, int32_t embd, int32_t n_seq_max) {
    llama_batch batch = {
        /*n_tokens       =*/ 0,
        /*tokens         =*/ nullptr,
        /*embd           =*/ nullptr,
        /*pos            =*/ nullptr,
        /*n_seq_id       =*/ nullptr,
        /*seq_id         =*/ nullptr,
        /*logits         =*/ nullptr,
    };

    if (embd) {
        batch.embd = (float *) malloc(sizeof(float) * n_tokens_alloc * embd);
    } else {
        batch.token = (llama_token *) malloc(sizeof(llama_token) * n_tokens_alloc);
    }

    batch.pos      = (llama_pos *)     malloc(sizeof(llama_pos)      * n_tokens_alloc);
    batch.n_seq_id = (int32_t *)       malloc(sizeof(int32_t)        * n_tokens_alloc);
    batch.seq_id   = (llama_seq_id **) malloc(sizeof(llama_seq_id *) * (n_tokens_alloc + 1));
    for (int i = 0; i < n_tokens_alloc; ++i) {
        batch.seq_id[i] = (llama_seq_id *) malloc(sizeof(llama_seq_id) * n_seq_max);
    }
    batch.seq_id[n_tokens_alloc] = nullptr;

    batch.logits   = (int8_t *)        malloc(sizeof(int8_t)         * n_tokens_alloc);

    return batch;
}